

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_limit_aspect_ratio_field(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *aspect_ratio_field)

{
  undefined1 auVar1 [16];
  double dVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 local_98 [16];
  double local_88;
  
  if (ref_grid->twod == 0) {
    for (lVar5 = 0; lVar5 < ref_grid->node->max; lVar5 = lVar5 + 1) {
      if (-1 < ref_grid->node->global[lVar5]) {
        dVar13 = aspect_ratio_field[lVar5];
        uVar3 = ref_matrix_diag_m(metric,(REF_DBL *)local_98);
        if (uVar3 != 0) {
          pcVar6 = "eigen decomp";
          uVar4 = 0x825;
          goto LAB_001b1776;
        }
        dVar7 = local_98._8_8_;
        if (local_98._8_8_ <= local_98._0_8_) {
          dVar7 = local_98._0_8_;
        }
        dVar2 = local_88;
        if (local_88 <= dVar7) {
          dVar2 = dVar7;
        }
        dVar13 = dVar13 * dVar13;
        auVar12._0_8_ = dVar13 * 1e+20;
        auVar12._8_8_ = dVar2;
        auVar9._8_8_ = -dVar2;
        auVar9._0_8_ = -auVar12._0_8_;
        auVar9 = maxpd(auVar12,auVar9);
        if (auVar9._8_8_ < auVar9._0_8_) {
          auVar10._0_8_ = dVar2 / dVar13;
          if (local_88 <= auVar10._0_8_) {
            local_88 = auVar10._0_8_;
          }
          auVar10._8_8_ = auVar10._0_8_;
          local_98 = maxpd(local_98,auVar10);
          uVar3 = ref_matrix_form_m((REF_DBL *)local_98,metric);
          if (uVar3 != 0) {
            pcVar6 = "reform m";
            uVar4 = 0x831;
            goto LAB_001b1776;
          }
        }
      }
      metric = metric + 6;
    }
  }
  else {
    for (lVar5 = 0; lVar5 < ref_grid->node->max; lVar5 = lVar5 + 1) {
      if (-1 < ref_grid->node->global[lVar5]) {
        dVar13 = aspect_ratio_field[lVar5];
        uVar3 = ref_matrix_diag_m(metric,(REF_DBL *)local_98);
        if (uVar3 != 0) {
          pcVar6 = "eigen decomp";
          uVar4 = 0x813;
LAB_001b1776:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar4,"ref_metric_limit_aspect_ratio_field",(ulong)uVar3,pcVar6);
          return uVar3;
        }
        uVar3 = ref_matrix_descending_eig_twod((REF_DBL *)local_98);
        if (uVar3 != 0) {
          pcVar6 = "2D eig sort";
          uVar4 = 0x814;
          goto LAB_001b1776;
        }
        dVar7 = local_98._8_8_;
        if (local_98._8_8_ <= local_98._0_8_) {
          dVar7 = local_98._0_8_;
        }
        dVar13 = dVar13 * dVar13;
        auVar8._0_8_ = dVar13 * 1e+20;
        auVar8._8_8_ = dVar7;
        auVar11._0_8_ = -auVar8._0_8_;
        auVar11._8_8_ = -dVar7;
        auVar9 = maxpd(auVar8,auVar11);
        if (auVar9._8_8_ < auVar9._0_8_) {
          dVar7 = dVar7 / dVar13;
          auVar1._8_8_ = dVar7;
          auVar1._0_8_ = dVar7;
          local_98 = maxpd(local_98,auVar1);
          uVar3 = ref_matrix_form_m((REF_DBL *)local_98,metric);
          if (uVar3 != 0) {
            pcVar6 = "reform m";
            uVar4 = 0x81d;
            goto LAB_001b1776;
          }
          uVar3 = ref_matrix_twod_m(metric);
          if (uVar3 != 0) {
            pcVar6 = "enforce 2D m for roundoff";
            uVar4 = 0x81f;
            goto LAB_001b1776;
          }
        }
      }
      metric = metric + 6;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_aspect_ratio_field(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL *aspect_ratio_field) {
  REF_DBL diag_system[12];
  REF_DBL max_eig, limit_eig;
  REF_INT node;
  REF_DBL aspect_ratio;
  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      aspect_ratio = aspect_ratio_field[node];
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      RSS(ref_matrix_descending_eig_twod(diag_system), "2D eig sort");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      if (ref_math_divisible(max_eig, (aspect_ratio * aspect_ratio))) {
        limit_eig = max_eig / (aspect_ratio * aspect_ratio);
        ref_matrix_eig(diag_system, 0) =
            MAX(ref_matrix_eig(diag_system, 0), limit_eig);
        ref_matrix_eig(diag_system, 1) =
            MAX(ref_matrix_eig(diag_system, 1), limit_eig);
        RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
        RSS(ref_matrix_twod_m(&(metric[6 * node])),
            "enforce 2D m for roundoff");
      }
    }
  } else {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      aspect_ratio = aspect_ratio_field[node];
      RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
      max_eig = ref_matrix_eig(diag_system, 0);
      max_eig = MAX(ref_matrix_eig(diag_system, 1), max_eig);
      max_eig = MAX(ref_matrix_eig(diag_system, 2), max_eig);
      if (ref_math_divisible(max_eig, (aspect_ratio * aspect_ratio))) {
        limit_eig = max_eig / (aspect_ratio * aspect_ratio);
        ref_matrix_eig(diag_system, 0) =
            MAX(ref_matrix_eig(diag_system, 0), limit_eig);
        ref_matrix_eig(diag_system, 1) =
            MAX(ref_matrix_eig(diag_system, 1), limit_eig);
        ref_matrix_eig(diag_system, 2) =
            MAX(ref_matrix_eig(diag_system, 2), limit_eig);
        RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
      }
    }
  }
  return REF_SUCCESS;
}